

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O1

void __thiscall
amrex::StateData::FillBoundary
          (StateData *this,FArrayBox *dest,Real time,Real *dx,RealBox *prob_domain,int dest_comp,
          int src_comp,int num_comp)

{
  Box *this_00;
  Box *b;
  IntVect *pIVar1;
  IntVect *pIVar2;
  int iVar3;
  StateDescriptor *this_01;
  bool bVar4;
  int k;
  long lVar5;
  double *pdVar6;
  BCRec *pBVar7;
  BndryFunc *pBVar8;
  undefined4 uVar9;
  int iVar10;
  int *bxlo;
  int *dlo;
  undefined4 uVar11;
  int iVar12;
  pointer piVar13;
  int *dhi;
  int i;
  int iVar14;
  Real time_local;
  int local_9c;
  BCRec bcr;
  int aiStack_80 [2];
  Vector<int,_std::allocator<int>_> bcrs;
  Real xlo [3];
  
  this_00 = &this->domain;
  b = &(dest->super_BaseFab<double>).domain;
  time_local = time;
  bVar4 = Box::contains(this_00,b);
  if (!bVar4) {
    pIVar2 = &(dest->super_BaseFab<double>).domain.bigend;
    bcrs.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    bcrs.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bcrs.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bcr.bc[0] = -0x29a;
    bcr.bc[1] = -0x29a;
    bcr.bc[2] = -0x29a;
    bcr.bc[3] = -0x29a;
    bcr.bc[4] = -0x29a;
    bcr.bc[5] = -0x29a;
    lVar5 = 0;
    do {
      *(double *)((long)xlo + lVar5 * 2) =
           (double)(*(int *)((long)(b->smallend).vect + lVar5) -
                   *(int *)((long)(this_00->smallend).vect + lVar5)) *
           *(double *)((long)dx + lVar5 * 2) + *(double *)((long)prob_domain->xlo + lVar5 * 2);
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0xc);
    if (0 < num_comp) {
      pIVar1 = &(this->domain).bigend;
      iVar14 = 0;
      do {
        i = src_comp + iVar14;
        pdVar6 = BaseFab<double>::dataPtr(&dest->super_BaseFab<double>,dest_comp + iVar14);
        this_01 = this->desc;
        if ((this_01->m_primary).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [i] == 0) {
          pBVar7 = StateDescriptor::getBC(this_01,i);
          lVar5 = 0;
          do {
            uVar9 = 0;
            uVar11 = 0;
            if (*(int *)((long)(b->smallend).vect + lVar5) <=
                *(int *)((long)(this_00->smallend).vect + lVar5)) {
              uVar11 = *(undefined4 *)((long)pBVar7->bc + lVar5);
            }
            *(undefined4 *)((long)bcr.bc + lVar5) = uVar11;
            if (*(int *)((long)(this->domain).bigend.vect + lVar5) <=
                *(int *)((long)(dest->super_BaseFab<double>).domain.bigend.vect + lVar5)) {
              uVar9 = *(undefined4 *)((long)pBVar7->bc + lVar5 + 0xc);
            }
            *(undefined4 *)((long)bcr.bc + lVar5 + 0xc) = uVar9;
            lVar5 = lVar5 + 4;
          } while (lVar5 != 0xc);
          pBVar8 = StateDescriptor::bndryFill(this->desc,i);
          (*pBVar8->_vptr_BndryFunc[3])
                    (pBVar8,pdVar6,b,pIVar2,this_00,pIVar1,dx,xlo,&time_local,&bcr);
LAB_004ff948:
          iVar14 = iVar14 + 1;
        }
        else {
          iVar3 = (this_01->m_groupsize).super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[i];
          if (num_comp < iVar3 + iVar14) {
            pBVar7 = StateDescriptor::getBC(this_01,i);
            lVar5 = 0;
            do {
              uVar9 = 0;
              uVar11 = 0;
              if (*(int *)((long)(b->smallend).vect + lVar5) <=
                  *(int *)((long)(this_00->smallend).vect + lVar5)) {
                uVar11 = *(undefined4 *)((long)pBVar7->bc + lVar5);
              }
              *(undefined4 *)((long)bcr.bc + lVar5) = uVar11;
              if (*(int *)((long)(this->domain).bigend.vect + lVar5) <=
                  *(int *)((long)(dest->super_BaseFab<double>).domain.bigend.vect + lVar5)) {
                uVar9 = *(undefined4 *)((long)pBVar7->bc + lVar5 + 0xc);
              }
              *(undefined4 *)((long)bcr.bc + lVar5 + 0xc) = uVar9;
              lVar5 = lVar5 + 4;
            } while (lVar5 != 0xc);
            pBVar8 = StateDescriptor::bndryFill(this->desc,i);
            (*pBVar8->_vptr_BndryFunc[3])
                      (pBVar8,pdVar6,b,pIVar2,this_00,pIVar1,dx,xlo,&time_local,&bcr);
            goto LAB_004ff948;
          }
          local_9c = iVar3 + iVar14;
          std::vector<int,_std::allocator<int>_>::resize
                    (&bcrs.super_vector<int,_std::allocator<int>_>,(long)iVar3 * 6);
          if (0 < iVar3) {
            iVar14 = 0;
            piVar13 = bcrs.super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            do {
              pBVar7 = StateDescriptor::getBC(this->desc,i + iVar14);
              lVar5 = -3;
              do {
                iVar10 = 0;
                iVar12 = 0;
                if ((dest->super_BaseFab<double>).domain.bigend.vect[lVar5] <= pIVar1->vect[lVar5])
                {
                  iVar12 = pBVar7->bc[lVar5 + 3];
                }
                bcr.bc[lVar5 + 3] = iVar12;
                if ((int)((IndexType *)(&(this->domain).bigend + 1))[lVar5].itype <=
                    (int)((IndexType *)(&(dest->super_BaseFab<double>).domain.bigend + 1))[lVar5].
                         itype) {
                  iVar10 = pBVar7[1].bc[lVar5];
                }
                aiStack_80[lVar5] = iVar10;
                lVar5 = lVar5 + 1;
              } while (lVar5 != 0);
              lVar5 = 0;
              do {
                piVar13[lVar5] = bcr.bc[lVar5];
                lVar5 = lVar5 + 1;
              } while (lVar5 != 6);
              piVar13 = piVar13 + 6;
              iVar14 = iVar14 + 1;
            } while (iVar14 != iVar3);
          }
          pBVar8 = StateDescriptor::bndryFill(this->desc,i);
          (*pBVar8->_vptr_BndryFunc[4])
                    (pBVar8,pdVar6,b,pIVar2,this_00,pIVar1,dx,xlo,&time_local,
                     bcrs.super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start,(long)iVar3);
          iVar14 = local_9c;
        }
      } while (iVar14 < num_comp);
    }
    if (bcrs.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(bcrs.super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start,(long)bcrs.super_vector<int,_std::allocator<int>_>.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage -
                               (long)bcrs.super_vector<int,_std::allocator<int>_>.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void
StateData::FillBoundary (FArrayBox&     dest,
                         Real           time,
                         const Real*    dx,
                         const RealBox& prob_domain,
                         int            dest_comp,
                         int            src_comp,
                         int            num_comp)
{
    BL_PROFILE("StateData::FillBoundary(dx)");
    BL_ASSERT(dest.box().ixType() == desc->getType());

    if (domain.contains(dest.box())) return;

    const Box& bx  = dest.box();
    const int* dlo = dest.loVect();
    const int* dhi = dest.hiVect();
    const int* plo = domain.loVect();
    const int* phi = domain.hiVect();

    Vector<int> bcrs;

    Real xlo[AMREX_SPACEDIM];
    BCRec bcr;
    const Real* problo = prob_domain.lo();

    for (int i = 0; i < AMREX_SPACEDIM; i++)
    {
        xlo[i] = problo[i] + dx[i]*(dlo[i]-plo[i]);
    }
    for (int i = 0; i < num_comp; )
    {
        const int dc  = dest_comp+i;
        const int sc  = src_comp+i;
        Real*     dat = dest.dataPtr(dc);

        if (desc->primary(sc))
        {
            const int groupsize = desc->groupsize(sc);

            BL_ASSERT(groupsize != 0);

            if (groupsize+i <= num_comp)
            {
                //
                // Can do the whole group at once.
                //
                bcrs.resize(2*AMREX_SPACEDIM*groupsize);

                int* bci  = bcrs.dataPtr();

                for (int j = 0; j < groupsize; j++)
                {
                    amrex::setBC(bx,domain,desc->getBC(sc+j),bcr);

                    const int* bc = bcr.vect();

                    for (int k = 0; k < 2*AMREX_SPACEDIM; k++)
                        bci[k] = bc[k];

                    bci += 2*AMREX_SPACEDIM;
                }
                //
                // Use the "group" boundary fill routine.
                //
                desc->bndryFill(sc)(dat,dlo,dhi,plo,phi,dx,xlo,&time,bcrs.dataPtr(),groupsize);
                i += groupsize;
            }
            else
            {
                amrex::setBC(bx,domain,desc->getBC(sc),bcr);
                desc->bndryFill(sc)(dat,dlo,dhi,plo,phi,dx,xlo,&time,bcr.vect());
                i++;
            }
        }
        else
        {
            amrex::setBC(bx,domain,desc->getBC(sc),bcr);
            desc->bndryFill(sc)(dat,dlo,dhi,plo,phi,dx,xlo,&time,bcr.vect());
            i++;
        }
    }

#ifdef AMREX_USE_GPU
    // Add a streamSynchronize here in case the user code launched kernels
    // to handle the boundary fills.
    Gpu::streamSynchronize();
#endif
}